

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O0

void __thiscall S2ShapeIndex::Iterator::Init(Iterator *this,S2ShapeIndex *index,InitialPosition pos)

{
  unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_> local_28;
  InitialPosition local_1c;
  S2ShapeIndex *pSStack_18;
  InitialPosition pos_local;
  S2ShapeIndex *index_local;
  Iterator *this_local;
  
  local_1c = pos;
  pSStack_18 = index;
  index_local = (S2ShapeIndex *)this;
  (*index->_vptr_S2ShapeIndex[6])(&local_28,index,(ulong)pos);
  std::unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>::
  operator=(&this->iter_,&local_28);
  std::unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>::
  ~unique_ptr(&local_28);
  return;
}

Assistant:

void Init(const S2ShapeIndex* index,
              InitialPosition pos = UNPOSITIONED) {
      iter_ = index->NewIterator(pos);
    }